

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O2

bool __thiscall QSliderPrivate::updateHoverControl(QSliderPrivate *this,QPoint *pos)

{
  SubControl SVar1;
  QWidget *this_00;
  bool bVar2;
  SubControl SVar3;
  long in_FS_OFFSET;
  QRect local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  local_48.x1.m_i = (this->hoverRect).x1.m_i;
  local_48.y1.m_i = (this->hoverRect).y1.m_i;
  local_48.x2.m_i = (this->hoverRect).x2.m_i;
  local_48.y2.m_i = (this->hoverRect).y2.m_i;
  SVar1 = this->hoverControl;
  bVar2 = QWidget::testAttribute_helper(this_00,WA_Hover);
  SVar3 = newHoverControl(this,pos);
  bVar2 = !bVar2;
  if ((!bVar2) && (SVar1 != SVar3)) {
    QWidget::update(this_00,&local_48);
    QWidget::update(this_00,&this->hoverRect);
    bVar2 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QSliderPrivate::updateHoverControl(const QPoint &pos)
{
    Q_Q(QSlider);
    QRect lastHoverRect = hoverRect;
    QStyle::SubControl lastHoverControl = hoverControl;
    bool doesHover = q->testAttribute(Qt::WA_Hover);
    if (lastHoverControl != newHoverControl(pos) && doesHover) {
        q->update(lastHoverRect);
        q->update(hoverRect);
        return true;
    }
    return !doesHover;
}